

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intercom_Control_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Intercom_Control_PDU::Intercom_Control_PDU
          (Intercom_Control_PDU *this,Header *H,KDataStream *stream)

{
  KDataStream *stream_local;
  Header *H_local;
  Intercom_Control_PDU *this_local;
  
  Header7::Header7(&this->super_Header,H);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Intercom_Control_PDU_0032c330;
  DATA_TYPE::CommunicationsChannelType::CommunicationsChannelType(&this->m_CommChannelType);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_SrcEnt);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_MstrEntID);
  std::
  vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
  ::vector(&this->m_vICP);
  (*(this->super_Header).super_Header6._vptr_Header6[3])(this,stream,1);
  return;
}

Assistant:

Intercom_Control_PDU::Intercom_Control_PDU(const Header &H, KDataStream &stream) noexcept(false) :
    Header( H )
{
    Decode( stream, true );
}